

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_cp1(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int fs)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i32 pTVar1;
  TCGv_i32 arg4;
  uintptr_t o_2;
  uintptr_t o_1;
  uintptr_t o_3;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  switch(opc << 0xb | opc + 0xbc000000 >> 0x15) {
  case 0:
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    gen_load_fpr32(ctx,pTVar1,fs);
    goto LAB_00882a82;
  case 1:
    gen_load_fpr64(ctx,t,fs);
    goto LAB_00882af2;
  case 2:
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx,fs);
    gen_helper_cfc1(tcg_ctx,t,tcg_ctx->cpu_env,pTVar1);
    goto LAB_00882a99;
  case 3:
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    gen_load_fpr32h(ctx,pTVar1,fs);
LAB_00882a82:
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx,t,pTVar1);
LAB_00882a99:
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
LAB_00882af2:
    gen_store_gpr(tcg_ctx,t,rt);
    break;
  case 4:
    gen_load_gpr(tcg_ctx,t,rt);
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,pTVar1,t);
    gen_store_fpr32(ctx,pTVar1,fs);
    goto LAB_00882ad4;
  case 5:
    gen_load_gpr(tcg_ctx,t,rt);
    gen_store_fpr64(ctx,t,fs);
    break;
  case 6:
    gen_load_gpr(tcg_ctx,t,rt);
    save_cpu_state(ctx,0);
    pTVar1 = tcg_const_i32_mips64el(tcg_ctx,fs);
    arg4 = tcg_const_i32_mips64el(tcg_ctx,rt);
    gen_helper_ctc1(tcg_ctx,tcg_ctx->cpu_env,t,pTVar1,arg4);
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(arg4 + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    (ctx->base).is_jmp = DISAS_TARGET_0;
    break;
  case 7:
    gen_load_gpr(tcg_ctx,t,rt);
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,pTVar1,t);
    gen_store_fpr32h(ctx,pTVar1,fs);
LAB_00882ad4:
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    break;
  default:
    generate_exception_end(ctx,0x14);
  }
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_cp1(DisasContext *ctx, uint32_t opc, int rt, int fs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);

    switch (opc) {
    case OPC_MFC1:
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32(ctx, fp0, fs);
            tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_MTC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
            gen_store_fpr32(ctx, fp0, fs);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    case OPC_CFC1:
        gen_helper_1e0i(cfc1, t0, fs);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_CTC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        save_cpu_state(ctx, 0);
        {
            TCGv_i32 fs_tmp = tcg_const_i32(tcg_ctx, fs);

            gen_helper_0e2i(ctc1, t0, fs_tmp, rt);
            tcg_temp_free_i32(tcg_ctx, fs_tmp);
        }
        /* Stop translation as we may have changed hflags */
        ctx->base.is_jmp = DISAS_STOP;
        break;
#if defined(TARGET_MIPS64)
    case OPC_DMFC1:
        gen_load_fpr64(ctx, t0, fs);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_DMTC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        gen_store_fpr64(ctx, t0, fs);
        break;
#endif
    case OPC_MFHC1:
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            gen_load_fpr32h(ctx, fp0, fs);
            tcg_gen_ext_i32_tl(tcg_ctx, t0, fp0);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_MTHC1:
        gen_load_gpr(tcg_ctx, t0, rt);
        {
            TCGv_i32 fp0 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, fp0, t0);
            gen_store_fpr32h(ctx, fp0, fs);
            tcg_temp_free_i32(tcg_ctx, fp0);
        }
        break;
    default:
        MIPS_INVAL("cp1 move");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

 out:
    tcg_temp_free(tcg_ctx, t0);
}